

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

int __thiscall
Connection::receive(Connection *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  int iVar1;
  int in_EDX;
  int __fd;
  int local_20;
  int local_1c;
  int i;
  int success;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  Connection *this_local;
  
  __fd = (int)data;
  local_1c = 0;
  iVar1 = open(this,(char *)data,in_EDX);
  if (iVar1 != 0) {
    for (local_20 = 0; local_20 < this->data_size; local_20 = local_20 + 1) {
      std::vector<float,_std::allocator<float>_>::clear(&this->buffer_data);
    }
    local_1c = close(this,__fd);
  }
  return local_1c;
}

Assistant:

int Connection::receive(std::vector<unsigned char> &data)
{
    //Function to receive data from the robot
    int success=0;
    if(open())
    {
        for(int i=0;i<data_size;i++)
        {
            buffer_data.clear();

            //buffer_data.push_back((float)data[i]);
        }

        success= close();

    }
    return success;
}